

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_glsl_op
          (CompilerHLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  uint32_t width;
  BaseType input_type;
  BaseType input_type_00;
  GLSLstd450 op_00;
  CompilerError *pCVar1;
  SPIRType *pSVar2;
  SPIRType *type;
  BaseType basetype;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  GLSLstd450 op;
  uint32_t count_local;
  uint32_t *args_local;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerHLSL *this_local;
  
  width = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  input_type = to_signed_basetype(width);
  input_type_00 = to_unsigned_basetype(width);
  op_00 = CompilerGLSL::get_remapped_glsl_op(&this->super_CompilerGLSL,eop);
  switch(op_00) {
  case GLSLstd450RoundEven:
    if ((this->hlsl_options).shader_model < 0x28) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar1,"roundEven is not supported in HLSL shader model 2/3.");
      __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,*args,"round");
    break;
  case GLSLstd450Trunc:
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,*args,"trunc");
    break;
  default:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    break;
  case GLSLstd450Fract:
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,*args,"frac");
    break;
  case GLSLstd450Asinh:
  case GLSLstd450Acosh:
  case GLSLstd450Atanh:
    CompilerGLSL::emit_emulated_ahyper_op(&this->super_CompilerGLSL,result_type,id,*args,op_00);
    break;
  case GLSLstd450Atan2:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,args[1],"atan2");
    break;
  case GLSLstd450InverseSqrt:
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,*args,"rsqrt");
    break;
  case GLSLstd450MatrixInverse:
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if ((pSVar2->vecsize == 2) && (pSVar2->columns == 2)) {
      if ((this->requires_inverse_2x2 & 1U) == 0) {
        this->requires_inverse_2x2 = true;
        Compiler::force_recompile((Compiler *)this);
      }
    }
    else if ((pSVar2->vecsize == 3) && (pSVar2->columns == 3)) {
      if ((this->requires_inverse_3x3 & 1U) == 0) {
        this->requires_inverse_3x3 = true;
        Compiler::force_recompile((Compiler *)this);
      }
    }
    else if (((pSVar2->vecsize == 4) && (pSVar2->columns == 4)) &&
            ((this->requires_inverse_4x4 & 1U) == 0)) {
      this->requires_inverse_4x4 = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,*args,"spvInverse");
    break;
  case GLSLstd450FMix:
  case GLSLstd450IMix:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,args[1],args[2],"lerp");
    break;
  case GLSLstd450Fma:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,args[1],args[2],"mad");
    break;
  case GLSLstd450PackSnorm4x8:
    if ((this->requires_snorm8_packing & 1U) == 0) {
      this->requires_snorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvPackSnorm4x8");
    break;
  case GLSLstd450PackUnorm4x8:
    if ((this->requires_unorm8_packing & 1U) == 0) {
      this->requires_unorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvPackUnorm4x8");
    break;
  case GLSLstd450PackSnorm2x16:
    if ((this->requires_snorm16_packing & 1U) == 0) {
      this->requires_snorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvPackSnorm2x16");
    break;
  case GLSLstd450PackUnorm2x16:
    if ((this->requires_unorm16_packing & 1U) == 0) {
      this->requires_unorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvPackUnorm2x16");
    break;
  case GLSLstd450PackHalf2x16:
    if ((this->requires_fp16_packing & 1U) == 0) {
      this->requires_fp16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvPackHalf2x16");
    break;
  case GLSLstd450PackDouble2x32:
  case GLSLstd450UnpackDouble2x32:
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar1,"packDouble2x32/unpackDouble2x32 not supported in HLSL.");
    __cxa_throw(pCVar1,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case GLSLstd450UnpackSnorm2x16:
    if ((this->requires_snorm16_packing & 1U) == 0) {
      this->requires_snorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvUnpackSnorm2x16");
    break;
  case GLSLstd450UnpackUnorm2x16:
    if ((this->requires_unorm16_packing & 1U) == 0) {
      this->requires_unorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvUnpackUnorm2x16");
    break;
  case GLSLstd450UnpackHalf2x16:
    if ((this->requires_fp16_packing & 1U) == 0) {
      this->requires_fp16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvUnpackHalf2x16");
    break;
  case GLSLstd450UnpackSnorm4x8:
    if ((this->requires_snorm8_packing & 1U) == 0) {
      this->requires_snorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvUnpackSnorm4x8");
    break;
  case GLSLstd450UnpackUnorm4x8:
    if ((this->requires_unorm8_packing & 1U) == 0) {
      this->requires_unorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"spvUnpackUnorm4x8");
    break;
  case GLSLstd450Normalize:
    pSVar2 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar2->vecsize == 1) {
      CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,*args,"sign");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    }
    break;
  case GLSLstd450FaceForward:
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if (pSVar2->vecsize == 1) {
      if ((this->requires_scalar_faceforward & 1U) == 0) {
        this->requires_scalar_faceforward = true;
        Compiler::force_recompile((Compiler *)this);
      }
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,result_type,id,*args,args[1],args[2],"spvFaceForward");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    }
    break;
  case GLSLstd450Reflect:
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if (pSVar2->vecsize == 1) {
      if ((this->requires_scalar_reflect & 1U) == 0) {
        this->requires_scalar_reflect = true;
        Compiler::force_recompile((Compiler *)this);
      }
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,result_type,id,*args,args[1],"spvReflect");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    }
    break;
  case GLSLstd450Refract:
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type);
    if (pSVar2->vecsize == 1) {
      if ((this->requires_scalar_refract & 1U) == 0) {
        this->requires_scalar_refract = true;
        Compiler::force_recompile((Compiler *)this);
      }
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,result_type,id,*args,args[1],args[2],"spvRefract");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    }
    break;
  case GLSLstd450FindILsb:
    pSVar2 = Compiler::expression_type((Compiler *)this,*args);
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,*args,"firstbitlow",pSVar2->basetype,
               pSVar2->basetype);
    break;
  case GLSLstd450FindSMsb:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,*args,"firstbithigh",input_type,input_type);
    break;
  case GLSLstd450FindUMsb:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,*args,"firstbithigh",input_type_00,
               input_type_00);
    break;
  case GLSLstd450InterpolateAtCentroid:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,"EvaluateAttributeAtCentroid");
    break;
  case GLSLstd450InterpolateAtSample:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,args[1],"EvaluateAttributeAtSample");
    break;
  case GLSLstd450InterpolateAtOffset:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type,id,*args,args[1],"EvaluateAttributeSnapped");
    break;
  case GLSLstd450NMin:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,0x25,args,count);
    break;
  case GLSLstd450NMax:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,0x28,args,count);
    break;
  case GLSLstd450NClamp:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,0x2b,args,count);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	op = get_remapped_glsl_op(op);

	switch (op)
	{
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;

	case GLSLstd450Fract:
		emit_unary_func_op(result_type, id, args[0], "frac");
		break;

	case GLSLstd450RoundEven:
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("roundEven is not supported in HLSL shader model 2/3.");
		emit_unary_func_op(result_type, id, args[0], "round");
		break;

	case GLSLstd450Trunc:
		emit_unary_func_op(result_type, id, args[0], "trunc");
		break;

	case GLSLstd450Acosh:
	case GLSLstd450Asinh:
	case GLSLstd450Atanh:
		// These are not supported in HLSL, always emulate them.
		emit_emulated_ahyper_op(result_type, id, args[0], op);
		break;

	case GLSLstd450FMix:
	case GLSLstd450IMix:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "lerp");
		break;

	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "atan2");
		break;

	case GLSLstd450Fma:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "mad");
		break;

	case GLSLstd450InterpolateAtCentroid:
		emit_unary_func_op(result_type, id, args[0], "EvaluateAttributeAtCentroid");
		break;
	case GLSLstd450InterpolateAtSample:
		emit_binary_func_op(result_type, id, args[0], args[1], "EvaluateAttributeAtSample");
		break;
	case GLSLstd450InterpolateAtOffset:
		emit_binary_func_op(result_type, id, args[0], args[1], "EvaluateAttributeSnapped");
		break;

	case GLSLstd450PackHalf2x16:
		if (!requires_fp16_packing)
		{
			requires_fp16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackHalf2x16");
		break;

	case GLSLstd450UnpackHalf2x16:
		if (!requires_fp16_packing)
		{
			requires_fp16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackHalf2x16");
		break;

	case GLSLstd450PackSnorm4x8:
		if (!requires_snorm8_packing)
		{
			requires_snorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackSnorm4x8");
		break;

	case GLSLstd450UnpackSnorm4x8:
		if (!requires_snorm8_packing)
		{
			requires_snorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackSnorm4x8");
		break;

	case GLSLstd450PackUnorm4x8:
		if (!requires_unorm8_packing)
		{
			requires_unorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackUnorm4x8");
		break;

	case GLSLstd450UnpackUnorm4x8:
		if (!requires_unorm8_packing)
		{
			requires_unorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackUnorm4x8");
		break;

	case GLSLstd450PackSnorm2x16:
		if (!requires_snorm16_packing)
		{
			requires_snorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackSnorm2x16");
		break;

	case GLSLstd450UnpackSnorm2x16:
		if (!requires_snorm16_packing)
		{
			requires_snorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackSnorm2x16");
		break;

	case GLSLstd450PackUnorm2x16:
		if (!requires_unorm16_packing)
		{
			requires_unorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackUnorm2x16");
		break;

	case GLSLstd450UnpackUnorm2x16:
		if (!requires_unorm16_packing)
		{
			requires_unorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackUnorm2x16");
		break;

	case GLSLstd450PackDouble2x32:
	case GLSLstd450UnpackDouble2x32:
		SPIRV_CROSS_THROW("packDouble2x32/unpackDouble2x32 not supported in HLSL.");

	case GLSLstd450FindILsb:
	{
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "firstbitlow", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "firstbithigh", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "firstbithigh", uint_type, uint_type);
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &type = get<SPIRType>(result_type);
		if (type.vecsize == 2 && type.columns == 2)
		{
			if (!requires_inverse_2x2)
			{
				requires_inverse_2x2 = true;
				force_recompile();
			}
		}
		else if (type.vecsize == 3 && type.columns == 3)
		{
			if (!requires_inverse_3x3)
			{
				requires_inverse_3x3 = true;
				force_recompile();
			}
		}
		else if (type.vecsize == 4 && type.columns == 4)
		{
			if (!requires_inverse_4x4)
			{
				requires_inverse_4x4 = true;
				force_recompile();
			}
		}
		emit_unary_func_op(result_type, id, args[0], "spvInverse");
		break;
	}

	case GLSLstd450Normalize:
		// HLSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Returns -1 or 1 for valid input, sign() does the job.
			emit_unary_func_op(result_type, id, args[0], "sign");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_reflect)
			{
				requires_scalar_reflect = true;
				force_recompile();
			}
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_refract)
			{
				requires_scalar_refract = true;
				force_recompile();
			}
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_faceforward)
			{
				requires_scalar_faceforward = true;
				force_recompile();
			}
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450NMin:
		CompilerGLSL::emit_glsl_op(result_type, id, GLSLstd450FMin, args, count);
		break;

	case GLSLstd450NMax:
		CompilerGLSL::emit_glsl_op(result_type, id, GLSLstd450FMax, args, count);
		break;

	case GLSLstd450NClamp:
		CompilerGLSL::emit_glsl_op(result_type, id, GLSLstd450FClamp, args, count);
		break;

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}